

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFileWriter.cpp
# Opt level: O3

int __thiscall AudioFileWriter::close(AudioFileWriter *this,int __fd)

{
  int iVar1;
  uchar headerBuffer [44];
  undefined4 local_48;
  int iStack_44;
  uchar auStack_40 [16];
  uint local_30;
  int local_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  int iStack_20;
  
  if (this->waveMode == true) {
    iVar1 = QFile::size();
    builtin_memcpy(auStack_40,"WAVEfmt \x10",10);
    uStack_28 = 0x100004;
    auStack_40[10] = '\0';
    auStack_40[0xb] = '\0';
    auStack_40[0xc] = '\x01';
    auStack_40[0xd] = '\0';
    auStack_40[0xe] = '\x02';
    auStack_40[0xf] = '\0';
    _local_48 = CONCAT44(iVar1 + -8,0x46464952);
    _uStack_24 = CONCAT44(iVar1 + -0x2c,0x61746164);
    local_30 = this->sampleRate;
    local_2c = local_30 << 2;
    QFileDevice::seek((longlong)&this->file);
    QIODevice::write((char *)&this->file,(longlong)&local_48);
  }
  iVar1 = QFileDevice::close();
  return iVar1;
}

Assistant:

void AudioFileWriter::close() {
	if (waveMode) {
		uchar headerBuffer[WAVE_HEADER_LENGTH];
		quint32 fileSize = (quint32)file.size();
		memcpy(headerBuffer, WAVE_HEADER, WAVE_HEADER_LENGTH);
		qToLittleEndian(fileSize - RIFF_HEADER_LENGTH, headerBuffer + RIFF_PAYLOAD_SIZE_OFFSET);
		qToLittleEndian(fileSize - WAVE_HEADER_LENGTH, headerBuffer + WAVE_DATA_SIZE_OFFSET);
		qToLittleEndian(sampleRate, headerBuffer + WAVE_SAMPLE_RATE_OFFSET);
		qToLittleEndian(sampleRate * FRAME_SIZE, headerBuffer + WAVE_BYTE_RATE_OFFSET);
		file.seek(0);
		file.write((char *)headerBuffer, WAVE_HEADER_LENGTH);
	}
	file.close();
}